

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O3

void outflushn_stream(out_stream_info *stream,int nl)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  bool bVar4;
  ushort **ppuVar5;
  size_t sVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  char *txt;
  
  bVar1 = stream->linepos;
  uVar10 = (ulong)bVar1;
  stream->linebuf[uVar10] = '\0';
  uVar8 = bVar1 - 1;
  uVar9 = uVar8;
  if ((nl & 0xfffffffbU) != 0 && bVar1 != 0) {
    do {
      iVar7 = (int)uVar10;
      cVar2 = stream->linebuf[iVar7 - 1U];
      uVar9 = uVar8;
      if (((long)cVar2 < 0) ||
         (ppuVar5 = __ctype_b_loc(), uVar9 = iVar7 - 1U,
         (*(byte *)((long)*ppuVar5 + (long)cVar2 * 2 + 1) & 0x20) == 0)) goto LAB_001302bb;
      uVar8 = uVar8 - 1;
      uVar10 = (ulong)(iVar7 - 1U);
    } while (iVar7 - 1U != 0 && 0 < iVar7);
    uVar9 = 0xffffffff;
  }
LAB_001302bb:
  if (nl == 3) {
    iVar7 = stream->preview;
    if (iVar7 <= (int)uVar9) {
      t_outline(stream,0,stream->linebuf + iVar7,stream->attrbuf + iVar7);
      iVar7 = stream->preview;
      sVar6 = strlen(stream->linebuf + iVar7);
      stream->preview = (int)sVar6 + iVar7;
    }
    goto LAB_0013040d;
  }
  stream->linebuf[uVar9 + 1] = '\0';
  if (nl == 2) {
    bVar4 = false;
    txt = " ";
LAB_00130348:
    iVar7 = 0;
  }
  else {
    if (nl != 1) {
      txt = (char *)0x0;
      bVar4 = true;
      goto LAB_00130348;
    }
    iVar7 = 1;
    txt = "\n";
    if ((stream->linecol == '\0') && (stream->just_did_nl != 0)) {
      bVar4 = false;
      if (stream->html_pre_level == 0) {
        bVar4 = true;
        txt = (char *)0x0;
        goto LAB_00130348;
      }
    }
    else {
      bVar4 = false;
    }
  }
  iVar3 = stream->preview;
  if (((stream->linebuf[iVar3] != '\0') ||
      (((stream->linecol != '\0' && (stream->just_did_nl == 0)) || (0 < stream->html_pre_level))))
     && (t_outline(stream,iVar7,stream->linebuf + iVar3,stream->attrbuf + iVar3), !bVar4)) {
    t_outline(stream,0,txt,(int *)0x0);
  }
  if (nl == 0) {
    os_flush();
  }
  else {
    if (nl == 1) {
      if ((stream->html_mode != 0) && (stream->html_target != 0)) {
        t_outline(stream,0,"<BR HEIGHT=0>",(int *)0x0);
      }
      stream->preview = 0;
      stream->just_did_nl = 1;
      stream->linepos = '\0';
      stream->linecol = '\0';
      goto LAB_0013040d;
    }
    stream->linecol = '\0';
  }
  stream->preview = 0;
  stream->linepos = '\0';
  if (stream->linebuf[0] != '\0') {
    stream->just_did_nl = 0;
  }
LAB_0013040d:
  if (stream->cur_attr != stream->os_attr) {
    os_set_text_attr(stream->cur_attr);
    stream->os_attr = stream->cur_attr;
  }
  return;
}

Assistant:

static void outflushn_stream(out_stream_info *stream, int nl)
{
    int i;

    /* null-terminate the current output line buffer */
    stream->linebuf[stream->linepos] = '\0';

    /* note the position of the last character to display */
    i = stream->linepos - 1;

    /* if we're adding anything, remove trailing spaces */
    if (nl != 0 && nl != 4)
    {
        /* look for last non-space character */
        for ( ; i >= 0 && outissp(stream->linebuf[i]) ; --i) ;
    }

    /* check the output mode */
    if (nl == 3)
    {
        /* 
         *   this is the special "preview" mode -- only display the part
         *   that we haven't already previewed for this same line
         */
        if (i + 1 > stream->preview)
        {
            /* write out the line */
            t_outline(stream, 0, &stream->linebuf[stream->preview],
                      &stream->attrbuf[stream->preview]);

            /* skip past the part we wrote */
            stream->preview += strlen(&stream->linebuf[stream->preview]);
        }
    }
    else
    {
        char *suffix;           /* extra text to add after the flushed text */
        int   countnl = 0;         /* true if line counts for [more] paging */

        /* null-terminate the buffer at the current position */
        stream->linebuf[++i] = '\0';

        /* check the mode */
        switch(nl)
        {
        case 0:
        case 3:
        case 4:
            /* no newline - just flush out what we have with no suffix */
            suffix = 0;
            break;

        case 1:
            /* 
             *   Add a newline.  If there's nothing in the current line,
             *   or we just wrote out a newline, do not add an extra
             *   newline.  Keep all newlines in PRE mode.
             */
            if (stream->linecol != 0 || !stream->just_did_nl
                || stream->html_pre_level != 0)
            {
                /* add a newline after the text */
                suffix = "\n";
                
                /* count the line in the page size */
                countnl = 1;
            }
            else
            {
                /* don't add a newline */
                suffix = 0;
            }
            break;

        case 2:
            /* 
             *   we're going to depend on the underlying OS output layer
             *   to do line breaking, so don't add a newline, but do add a
             *   space, so that the underlying OS layer knows we have a
             *   word break here 
             */
            suffix = " ";
            break;
        }

        /* 
         *   display the line, as long as we have something buffered to
         *   display; even if we don't, display it if our column is
         *   non-zero and we didn't just do a newline, since this must
         *   mean that we've flushed a partial line and are just now doing
         *   the newline 
         */
        if (stream->linebuf[stream->preview] != '\0'
            || (stream->linecol != 0 && !stream->just_did_nl)
            || stream->html_pre_level > 0)
        {
            /* write it out */
            t_outline(stream, countnl, &stream->linebuf[stream->preview],
                      &stream->attrbuf[stream->preview]);

            /* write the suffix, if any */
            if (suffix != 0)
                t_outline(stream, 0, suffix, 0);
        }

        /* generate an HTML line break if necessary */
        if (nl == 1 && stream->html_mode && stream->html_target)
            t_outline(stream, 0, "<BR HEIGHT=0>", 0);

        if (nl == 0)
        {
            /* we're not displaying a newline, so flush what we have */
            os_flush();
        }
        else
        {
            /* we displayed a newline, so reset the column position */
            stream->linecol = 0;
        }

        /* reset the line output buffer position */
        stream->linepos = stream->preview = 0;

        /* 
         *   If we just output a newline, note it.  If we didn't just
         *   output a newline, but we did write out anything else, note
         *   that we're no longer at the start of a line on the underlying
         *   output device.  
         */
        if (nl == 1)
            stream->just_did_nl = TRUE;
        else if (stream->linebuf[stream->preview] != '\0')
            stream->just_did_nl = FALSE;
    }

    /* 
     *   If the osifc-level attributes don't match the current attributes,
     *   bring the osifc layer up to date.  This is necessary in cases where
     *   we set attributes immediately before asking for input - we
     *   essentially need to flush the attributes without flushing any text.
     */
    if (stream->cur_attr != stream->os_attr)
    {
        /* set the osifc attributes */
        os_set_text_attr(stream->cur_attr);

        /* remember the new attributes as the current osifc attributes */
        stream->os_attr = stream->cur_attr;
    }
}